

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_expr.cpp
# Opt level: O0

double nivalis::detail::eval_ast
                 (Environment *env,AST *ast,vector<double,_std::allocator<double>_> *arg_vals)

{
  anon_union_8_3_343d95dd_for_ASTNode_1 aVar1;
  value_type vVar2;
  uint32_t uVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  anon_union_8_3_343d95dd_for_ASTNode_1 *paVar7;
  const_reference pvVar8;
  reference pvVar9;
  const_reference pvVar10;
  size_type sVar11;
  reference pvVar12;
  reference pvVar13;
  common_type_t<long,_long> cVar14;
  double *pdVar15;
  reference pvVar16;
  vector<double,_std::allocator<double>_> *in_RDX;
  Environment *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  long *in_FS_OFFSET;
  double dVar17;
  type tVar18;
  type tVar19;
  double dVar20;
  __type _Var21;
  uint n;
  int64_t step;
  int64_t b;
  int64_t a;
  uint64_t var_id;
  size_t i;
  vector<double,_std::allocator<double>_> f_args;
  value_type *func;
  size_t n_args;
  value_type *node;
  size_t cidx;
  bool _is_thunk_ret;
  size_t init_top;
  undefined4 in_stack_fffffffffffffb78;
  float in_stack_fffffffffffffb7c;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffb80;
  value_type_conflict *in_stack_fffffffffffffb88;
  allocator_type *in_stack_fffffffffffffb90;
  double in_stack_fffffffffffffb98;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffba0;
  int local_394;
  bool local_221;
  bool local_211;
  value_type local_160;
  double local_c0;
  undefined4 local_b4;
  long local_b0;
  long local_a8;
  long local_a0;
  uint64_t local_98;
  int local_8c;
  ulong local_88;
  vector<double,_std::allocator<double>_> local_68;
  reference local_50;
  ulong local_48;
  const_reference local_40;
  size_type local_38;
  byte local_29;
  vector<double,_std::allocator<double>_> *arg_vals_00;
  double local_8;
  
  if ((char)in_FS_OFFSET[-10] == '\0') {
    lVar4 = *in_FS_OFFSET;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x124438);
    __cxa_thread_atexit(std::vector<double,_std::allocator<double>_>::~vector,lVar4 + -0x68,
                        &__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -10) = 1;
  }
  if ((char)in_FS_OFFSET[-6] == '\0') {
    lVar4 = *in_FS_OFFSET;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x124485);
    __cxa_thread_atexit(std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector,
                        lVar4 + -0x48,&__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -6) = 1;
  }
  if ((char)in_FS_OFFSET[-2] == '\0') {
    lVar4 = *in_FS_OFFSET;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1244d2);
    __cxa_thread_atexit(std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector,
                        lVar4 + -0x28,&__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -2) = 1;
  }
  arg_vals_00 = *(vector<double,_std::allocator<double>_> **)(*in_FS_OFFSET + -0xb0);
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::size
            ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)in_RSI);
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_fffffffffffffba0,(size_type)in_stack_fffffffffffffb98);
  local_29 = 0;
  local_38 = std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::size
                       ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                        in_RSI);
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              while( true ) {
                while( true ) {
                  local_38 = local_38 - 1;
                  if (local_38 == 0xffffffffffffffff) {
                    lVar4 = *in_FS_OFFSET;
                    sVar11 = *(size_type *)(*in_FS_OFFSET + -0xb0);
                    *(size_type *)(*in_FS_OFFSET + -0xb0) = sVar11 - 1;
                    pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                                        ((vector<double,_std::allocator<double>_> *)(lVar4 + -0x68),
                                         sVar11);
                    return *pvVar16;
                  }
                  local_40 = std::
                             vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                             ::operator[]((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                           *)in_RSI,local_38);
                  uVar3 = local_40->opcode;
                  if (uVar3 != 0) break;
                  lVar4 = *in_FS_OFFSET;
                  sVar11 = *(size_type *)(*in_FS_OFFSET + -0xb0) + 1;
                  *(size_type *)(*in_FS_OFFSET + -0xb0) = sVar11;
                  pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                                      ((vector<double,_std::allocator<double>_> *)(lVar4 + -0x68),
                                       sVar11);
                  *pvVar16 = NAN;
                }
                if (uVar3 != 1) break;
                aVar1 = local_40->field_1;
                lVar4 = *in_FS_OFFSET;
                sVar11 = *(size_type *)(*in_FS_OFFSET + -0xb0) + 1;
                *(size_type *)(*in_FS_OFFSET + -0xb0) = sVar11;
                paVar7 = (anon_union_8_3_343d95dd_for_ASTNode_1 *)
                         std::vector<double,_std::allocator<double>_>::operator[]
                                   ((vector<double,_std::allocator<double>_> *)(lVar4 + -0x68),
                                    sVar11);
                *paVar7 = aVar1;
              }
              if (uVar3 != 2) break;
              pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                                  (in_RDI,(local_40->field_1).ref);
              vVar2 = *pvVar16;
              lVar4 = *in_FS_OFFSET;
              sVar11 = *(size_type *)(*in_FS_OFFSET + -0xb0) + 1;
              *(size_type *)(*in_FS_OFFSET + -0xb0) = sVar11;
              pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                                  ((vector<double,_std::allocator<double>_> *)(lVar4 + -0x68),sVar11
                                  );
              *pvVar16 = vVar2;
            }
            if (uVar3 != 3) break;
            pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                               (in_RDX,(local_40->field_1).ref);
            vVar2 = *pvVar8;
            lVar4 = *in_FS_OFFSET;
            sVar11 = *(size_type *)(*in_FS_OFFSET + -0xb0) + 1;
            *(size_type *)(*in_FS_OFFSET + -0xb0) = sVar11;
            pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)(lVar4 + -0x68),sVar11);
            *pvVar16 = vVar2;
          }
          if (uVar3 != 8) break;
          pvVar12 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                              (in_stack_fffffffffffffb80);
          local_38 = *pvVar12 + 1;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::pop_back
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x124cd4);
          local_29 = 1;
        }
        if (uVar3 != 9) break;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
        pvVar10 = std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
                  operator[]((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                              *)in_RSI,local_38);
        local_38 = local_38 - (pvVar10->field_1).ref;
      }
      if (uVar3 == 0xc) break;
      if (uVar3 == 0x10) {
        if ((local_29 & 1) == 0) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
          lVar4 = *in_FS_OFFSET;
          sVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                              (*in_FS_OFFSET + -0x48));
          pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                               *(size_type *)(*in_FS_OFFSET + -0xb0));
          pvVar12 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               (lVar4 + -0x48),(sVar11 - (*pvVar16 == 0.0)) - 1);
          local_38 = *pvVar12;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     (*in_FS_OFFSET + -0x48));
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     in_stack_fffffffffffffba0,(size_type)in_stack_fffffffffffffb98);
        }
        else {
          *(long *)(*in_FS_OFFSET + -0xb0) = *(long *)(*in_FS_OFFSET + -0xb0) + -1;
          local_29 = 0;
          pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                               *(long *)(*in_FS_OFFSET + -0xb0) + 1);
          vVar2 = *pvVar16;
          pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                               *(size_type *)(*in_FS_OFFSET + -0xb0));
          *pvVar16 = vVar2;
        }
      }
      else if (uVar3 - 0x11 < 2) {
        if ((local_29 & 1) == 0) {
          *(long *)(*in_FS_OFFSET + -0xb0) = *(long *)(*in_FS_OFFSET + -0xb0) + 1;
          pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                               *(long *)(*in_FS_OFFSET + -0xb0) - 1);
          vVar2 = *pvVar16;
          pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                               *(size_type *)(*in_FS_OFFSET + -0xb0));
          *pvVar16 = vVar2;
          pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                               *(long *)(*in_FS_OFFSET + -0xb0) - 2);
          vVar2 = *pvVar16;
          pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                               *(long *)(*in_FS_OFFSET + -0xb0) - 1);
          *pvVar16 = vVar2;
          local_160 = 1.0;
          if (local_40->opcode != 0x12) {
            local_160 = 0.0;
          }
          pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                               *(long *)(*in_FS_OFFSET + -0xb0) - 2);
          *pvVar16 = local_160;
        }
        else {
          *(long *)(*in_FS_OFFSET + -0xb0) = *(long *)(*in_FS_OFFSET + -0xb0) + -1;
          local_29 = 0;
          if (local_40->opcode == 0x12) {
            pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                                 *(long *)(*in_FS_OFFSET + -0xb0) + 1);
            dVar20 = *pvVar16;
            pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                                 *(long *)(*in_FS_OFFSET + -0xb0) - 2);
            *pvVar16 = dVar20 * *pvVar16;
          }
          else {
            pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                                 *(long *)(*in_FS_OFFSET + -0xb0) + 1);
            dVar20 = *pvVar16;
            pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                                 *(long *)(*in_FS_OFFSET + -0xb0) - 2);
            *pvVar16 = dVar20 + *pvVar16;
          }
        }
        local_98 = (local_40->field_1).ref;
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        local_a0 = (long)*pvVar16;
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(long *)(*in_FS_OFFSET + -0xb0) - 1);
        local_a8 = (long)*pvVar16;
        iVar5 = -1;
        if (local_a0 <= local_a8) {
          iVar5 = 1;
        }
        local_b0 = (long)iVar5;
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        uVar6 = std::isnan(*pvVar16);
        if ((uVar6 & 1) == 0) {
          dVar20 = (double)local_a0;
          pvVar16 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,local_98);
          *pvVar16 = dVar20;
          local_a0 = local_b0 + local_a0;
          if (local_a0 == local_a8 + local_b0) {
            pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                                 *(size_type *)(*in_FS_OFFSET + -0xb0));
            *pvVar16 = NAN;
          }
          else {
            dVar20 = (double)local_a0;
            pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                                 *(size_type *)(*in_FS_OFFSET + -0xb0));
            *pvVar16 = dVar20;
          }
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
          pvVar12 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                              (in_stack_fffffffffffffb80);
          local_38 = *pvVar12;
        }
        else {
          *(long *)(*in_FS_OFFSET + -0xb0) = *(long *)(*in_FS_OFFSET + -0xb0) + -2;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::pop_back
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1254fd);
        }
      }
      else if (uVar3 == 0x18) {
        *(long *)(*in_FS_OFFSET + -0xb0) = *(long *)(*in_FS_OFFSET + -0xb0) + -1;
      }
      else if (uVar3 == 0x20) {
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        dVar20 = *pvVar16;
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(long *)(*in_FS_OFFSET + -0xb0) - 1);
        *pvVar16 = dVar20 + *pvVar16;
        *(long *)(*in_FS_OFFSET + -0xb0) = *(long *)(*in_FS_OFFSET + -0xb0) + -1;
      }
      else if (uVar3 == 0x21) {
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        dVar20 = *pvVar16;
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(long *)(*in_FS_OFFSET + -0xb0) - 1);
        dVar17 = *pvVar16;
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(long *)(*in_FS_OFFSET + -0xb0) - 1);
        *pvVar16 = dVar20 - dVar17;
        *(long *)(*in_FS_OFFSET + -0xb0) = *(long *)(*in_FS_OFFSET + -0xb0) + -1;
      }
      else if (uVar3 == 0x30) {
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        dVar20 = *pvVar16;
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(long *)(*in_FS_OFFSET + -0xb0) - 1);
        *pvVar16 = dVar20 * *pvVar16;
        *(long *)(*in_FS_OFFSET + -0xb0) = *(long *)(*in_FS_OFFSET + -0xb0) + -1;
      }
      else if (uVar3 == 0x31) {
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        dVar20 = *pvVar16;
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(long *)(*in_FS_OFFSET + -0xb0) - 1);
        dVar17 = *pvVar16;
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(long *)(*in_FS_OFFSET + -0xb0) - 1);
        *pvVar16 = dVar20 / dVar17;
        *(long *)(*in_FS_OFFSET + -0xb0) = *(long *)(*in_FS_OFFSET + -0xb0) + -1;
      }
      else if (uVar3 == 0x32) {
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        dVar20 = *pvVar16;
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(long *)(*in_FS_OFFSET + -0xb0) - 1);
        dVar20 = fmod(dVar20,*pvVar16);
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(long *)(*in_FS_OFFSET + -0xb0) - 1);
        *pvVar16 = dVar20;
        *(long *)(*in_FS_OFFSET + -0xb0) = *(long *)(*in_FS_OFFSET + -0xb0) + -1;
      }
      else if (uVar3 == 0x40) {
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        dVar20 = *pvVar16;
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(long *)(*in_FS_OFFSET + -0xb0) - 1);
        dVar20 = pow(dVar20,*pvVar16);
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(long *)(*in_FS_OFFSET + -0xb0) - 1);
        *pvVar16 = dVar20;
        *(long *)(*in_FS_OFFSET + -0xb0) = *(long *)(*in_FS_OFFSET + -0xb0) + -1;
      }
      else if (uVar3 == 0x41) {
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        dVar20 = log(*pvVar16);
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(long *)(*in_FS_OFFSET + -0xb0) - 1);
        dVar17 = log(*pvVar16);
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(long *)(*in_FS_OFFSET + -0xb0) - 1);
        *pvVar16 = dVar20 / dVar17;
        *(long *)(*in_FS_OFFSET + -0xb0) = *(long *)(*in_FS_OFFSET + -0xb0) + -1;
      }
      else if (uVar3 == 0x50) {
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(long *)(*in_FS_OFFSET + -0xb0) - 1);
        pdVar15 = std::max<double>(pvVar16,pvVar13);
        dVar20 = *pdVar15;
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(long *)(*in_FS_OFFSET + -0xb0) - 1);
        *pvVar16 = dVar20;
        *(long *)(*in_FS_OFFSET + -0xb0) = *(long *)(*in_FS_OFFSET + -0xb0) + -1;
      }
      else if (uVar3 == 0x51) {
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(long *)(*in_FS_OFFSET + -0xb0) - 1);
        pdVar15 = std::min<double>(pvVar16,pvVar13);
        dVar20 = *pdVar15;
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(long *)(*in_FS_OFFSET + -0xb0) - 1);
        *pvVar16 = dVar20;
        *(long *)(*in_FS_OFFSET + -0xb0) = *(long *)(*in_FS_OFFSET + -0xb0) + -1;
      }
      else if (uVar3 == 0x52) {
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        local_211 = false;
        if ((*pvVar16 != 0.0) || (NAN(*pvVar16))) {
          pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                               *(long *)(*in_FS_OFFSET + -0xb0) - 1);
          local_211 = *pvVar16 != 0.0;
        }
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(long *)(*in_FS_OFFSET + -0xb0) - 1);
        *pvVar16 = (double)local_211;
        *(long *)(*in_FS_OFFSET + -0xb0) = *(long *)(*in_FS_OFFSET + -0xb0) + -1;
      }
      else if (uVar3 == 0x53) {
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        local_221 = true;
        if ((*pvVar16 == 0.0) && (!NAN(*pvVar16))) {
          pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                               *(long *)(*in_FS_OFFSET + -0xb0) - 1);
          local_221 = *pvVar16 != 0.0;
        }
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(long *)(*in_FS_OFFSET + -0xb0) - 1);
        *pvVar16 = (double)local_221;
        *(long *)(*in_FS_OFFSET + -0xb0) = *(long *)(*in_FS_OFFSET + -0xb0) + -1;
      }
      else if (uVar3 == 0x54) {
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        dVar20 = *pvVar16;
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(long *)(*in_FS_OFFSET + -0xb0) - 1);
        dVar17 = *pvVar16;
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(long *)(*in_FS_OFFSET + -0xb0) - 1);
        *pvVar16 = (double)((dVar20 != 0.0) != (dVar17 != 0.0));
        *(long *)(*in_FS_OFFSET + -0xb0) = *(long *)(*in_FS_OFFSET + -0xb0) + -1;
      }
      else if (uVar3 == 0x60) {
        lVar4 = *in_FS_OFFSET;
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(lVar4 + -0x68),
                             in_FS_OFFSET[-0x16]);
        dVar20 = *pvVar16;
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(lVar4 + -0x68),
                             in_FS_OFFSET[-0x16] - 1);
        dVar17 = *pvVar16;
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(long *)(*in_FS_OFFSET + -0xb0) - 1);
        *pvVar16 = (value_type)(-(ulong)(dVar20 < dVar17) & 0x3ff0000000000000);
        *(long *)(*in_FS_OFFSET + -0xb0) = *(long *)(*in_FS_OFFSET + -0xb0) + -1;
      }
      else if (uVar3 == 0x61) {
        lVar4 = *in_FS_OFFSET;
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(lVar4 + -0x68),
                             in_FS_OFFSET[-0x16]);
        dVar20 = *pvVar16;
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(lVar4 + -0x68),
                             in_FS_OFFSET[-0x16] - 1);
        dVar17 = *pvVar16;
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(long *)(*in_FS_OFFSET + -0xb0) - 1);
        *pvVar16 = (value_type)(-(ulong)(dVar20 <= dVar17) & 0x3ff0000000000000);
        *(long *)(*in_FS_OFFSET + -0xb0) = *(long *)(*in_FS_OFFSET + -0xb0) + -1;
      }
      else if (uVar3 == 0x62) {
        lVar4 = *in_FS_OFFSET;
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(lVar4 + -0x68),
                             in_FS_OFFSET[-0x16]);
        dVar20 = *pvVar16;
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(lVar4 + -0x68),
                             in_FS_OFFSET[-0x16] - 1);
        dVar17 = *pvVar16;
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(long *)(*in_FS_OFFSET + -0xb0) - 1);
        *pvVar16 = (value_type)(-(ulong)(dVar20 == dVar17) & 0x3ff0000000000000);
        *(long *)(*in_FS_OFFSET + -0xb0) = *(long *)(*in_FS_OFFSET + -0xb0) + -1;
      }
      else if (uVar3 == 99) {
        lVar4 = *in_FS_OFFSET;
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(lVar4 + -0x68),
                             in_FS_OFFSET[-0x16]);
        dVar20 = *pvVar16;
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(lVar4 + -0x68),
                             in_FS_OFFSET[-0x16] - 1);
        dVar17 = *pvVar16;
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(long *)(*in_FS_OFFSET + -0xb0) - 1);
        *pvVar16 = (value_type)(-(ulong)(dVar20 != dVar17) & 0x3ff0000000000000);
        *(long *)(*in_FS_OFFSET + -0xb0) = *(long *)(*in_FS_OFFSET + -0xb0) + -1;
      }
      else if (uVar3 == 100) {
        lVar4 = *in_FS_OFFSET;
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(lVar4 + -0x68),
                             in_FS_OFFSET[-0x16]);
        dVar20 = *pvVar16;
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(lVar4 + -0x68),
                             in_FS_OFFSET[-0x16] - 1);
        dVar17 = *pvVar16;
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(long *)(*in_FS_OFFSET + -0xb0) - 1);
        *pvVar16 = (value_type)(-(ulong)(dVar17 <= dVar20) & 0x3ff0000000000000);
        *(long *)(*in_FS_OFFSET + -0xb0) = *(long *)(*in_FS_OFFSET + -0xb0) + -1;
      }
      else if (uVar3 == 0x65) {
        lVar4 = *in_FS_OFFSET;
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(lVar4 + -0x68),
                             in_FS_OFFSET[-0x16]);
        dVar20 = *pvVar16;
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(lVar4 + -0x68),
                             in_FS_OFFSET[-0x16] - 1);
        dVar17 = *pvVar16;
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(long *)(*in_FS_OFFSET + -0xb0) - 1);
        *pvVar16 = (value_type)(-(ulong)(dVar17 < dVar20) & 0x3ff0000000000000);
        *(long *)(*in_FS_OFFSET + -0xb0) = *(long *)(*in_FS_OFFSET + -0xb0) + -1;
      }
      else if (uVar3 == 0x4000) {
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                   *(size_type *)(*in_FS_OFFSET + -0xb0));
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                   *(long *)(*in_FS_OFFSET + -0xb0) - 1);
        cVar14 = std::gcd<long,long>((long)in_stack_fffffffffffffba0,(long)in_stack_fffffffffffffb98
                                    );
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(long *)(*in_FS_OFFSET + -0xb0) - 1);
        *pvVar16 = (double)cVar14;
        *(long *)(*in_FS_OFFSET + -0xb0) = *(long *)(*in_FS_OFFSET + -0xb0) + -1;
      }
      else if (uVar3 == 0x4001) {
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        dVar20 = *pvVar16;
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(long *)(*in_FS_OFFSET + -0xb0) - 1);
        dVar17 = *pvVar16;
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                   *(size_type *)(*in_FS_OFFSET + -0xb0));
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                   *(long *)(*in_FS_OFFSET + -0xb0) - 1);
        cVar14 = std::gcd<long,long>((long)in_stack_fffffffffffffba0,(long)in_stack_fffffffffffffb98
                                    );
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(long *)(*in_FS_OFFSET + -0xb0) - 1);
        *pvVar16 = (dVar20 * dVar17) / (double)cVar14;
        *(long *)(*in_FS_OFFSET + -0xb0) = *(long *)(*in_FS_OFFSET + -0xb0) + -1;
      }
      else if (uVar3 == 0x4002) {
        lVar4 = *in_FS_OFFSET;
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(lVar4 + -0x68),in_FS_OFFSET[-0x16]);
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(lVar4 + -0x68),
                   in_FS_OFFSET[-0x16] - 1);
        dVar20 = boost::math::binomial_coefficient<double>
                           ((uint)((ulong)in_stack_fffffffffffffb80 >> 0x20),
                            (uint)in_stack_fffffffffffffb80);
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(long *)(*in_FS_OFFSET + -0xb0) - 1);
        *pvVar16 = dVar20;
        *(long *)(*in_FS_OFFSET + -0xb0) = *(long *)(*in_FS_OFFSET + -0xb0) + -1;
      }
      else if (uVar3 == 0x4003) {
        lVar4 = *in_FS_OFFSET;
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(lVar4 + -0x68),in_FS_OFFSET[-0x16]);
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(lVar4 + -0x68),
                   in_FS_OFFSET[-0x16] - 1);
        tVar19 = boost::math::falling_factorial<double>
                           ((double)in_stack_fffffffffffffb80,(uint)in_stack_fffffffffffffb7c);
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(long *)(*in_FS_OFFSET + -0xb0) - 1);
        *pvVar16 = tVar19;
        *(long *)(*in_FS_OFFSET + -0xb0) = *(long *)(*in_FS_OFFSET + -0xb0) + -1;
      }
      else if (uVar3 == 0x4004) {
        lVar4 = *in_FS_OFFSET;
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(lVar4 + -0x68),in_FS_OFFSET[-0x16]);
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(lVar4 + -0x68),
                   in_FS_OFFSET[-0x16] - 1);
        tVar19 = boost::math::rising_factorial<double>
                           ((double)in_stack_fffffffffffffb80,(int)in_stack_fffffffffffffb7c);
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(long *)(*in_FS_OFFSET + -0xb0) - 1);
        *pvVar16 = tVar19;
        *(long *)(*in_FS_OFFSET + -0xb0) = *(long *)(*in_FS_OFFSET + -0xb0) + -1;
      }
      else if (uVar3 == 0x4005) {
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                   *(size_type *)(*in_FS_OFFSET + -0xb0));
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                   *(long *)(*in_FS_OFFSET + -0xb0) - 1);
        tVar18 = boost::math::beta<double,double>
                           ((double)in_stack_fffffffffffffb80,
                            (double)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(long *)(*in_FS_OFFSET + -0xb0) - 1);
        *pvVar16 = tVar18;
        *(long *)(*in_FS_OFFSET + -0xb0) = *(long *)(*in_FS_OFFSET + -0xb0) + -1;
      }
      else if (uVar3 == 0x4006) {
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                   *(size_type *)(*in_FS_OFFSET + -0xb0));
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                   *(long *)(*in_FS_OFFSET + -0xb0) - 1);
        tVar19 = boost::math::polygamma<double>
                           ((int)((ulong)in_stack_fffffffffffffb80 >> 0x20),
                            (double)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(long *)(*in_FS_OFFSET + -0xb0) - 1);
        *pvVar16 = tVar19;
        *(long *)(*in_FS_OFFSET + -0xb0) = *(long *)(*in_FS_OFFSET + -0xb0) + -1;
      }
      else if (uVar3 == 0x8000) {
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        vVar2 = *pvVar16;
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        *pvVar16 = -vVar2;
      }
      else if (uVar3 == 0x8001) {
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             in_FS_OFFSET[-0x16]);
        dVar20 = *pvVar16;
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        *pvVar16 = (value_type)(-(ulong)(dVar20 == 0.0) & 0x3ff0000000000000);
      }
      else if (uVar3 == 0x8002) {
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        vVar2 = *pvVar16;
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        *pvVar16 = ABS(vVar2);
      }
      else if (uVar3 == 0x8003) {
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        dVar20 = sqrt(*pvVar16);
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        *pvVar16 = dVar20;
      }
      else if (uVar3 == 0x8004) {
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        dVar20 = *pvVar16;
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        *pvVar16 = dVar20 * *pvVar16;
      }
      else if (uVar3 == 0x8005) {
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        if (*pvVar16 <= 0.0) {
          pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                               *(size_type *)(*in_FS_OFFSET + -0xb0));
          local_394 = -1;
          if (*pvVar16 == 0.0) {
            local_394 = 0;
          }
        }
        else {
          local_394 = 1;
        }
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        *pvVar16 = (double)local_394;
      }
      else if (uVar3 == 0x8006) {
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        dVar20 = floor(*pvVar16);
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        *pvVar16 = dVar20;
      }
      else if (uVar3 == 0x8007) {
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        dVar20 = ceil(*pvVar16);
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        *pvVar16 = dVar20;
      }
      else if (uVar3 == 0x8008) {
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        dVar20 = round(*pvVar16);
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        *pvVar16 = dVar20;
      }
      else if (uVar3 == 0x8009) {
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        dVar20 = exp(*pvVar16);
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        *pvVar16 = dVar20;
      }
      else if (uVar3 == 0x800a) {
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        dVar20 = exp2(*pvVar16);
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        *pvVar16 = dVar20;
      }
      else if (uVar3 == 0x800b) {
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        dVar20 = log(*pvVar16);
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        *pvVar16 = dVar20;
      }
      else if (uVar3 == 0x800c) {
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        dVar20 = log10(*pvVar16);
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        *pvVar16 = dVar20;
      }
      else if (uVar3 == 0x800d) {
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        dVar20 = log2(*pvVar16);
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        *pvVar16 = dVar20;
      }
      else if (uVar3 == 0x800e) {
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             in_FS_OFFSET[-0x16]);
        local_c0 = 0.0;
        pdVar15 = std::max<double>(pvVar16,&local_c0);
        local_b4 = (undefined4)(long)*pdVar15;
        dVar20 = boost::math::factorial<double>(0);
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        *pvVar16 = dVar20;
      }
      else if (uVar3 == 0x800f) {
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        dVar20 = sin(*pvVar16);
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        *pvVar16 = dVar20;
      }
      else if (uVar3 == 0x8010) {
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        dVar20 = cos(*pvVar16);
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        *pvVar16 = dVar20;
      }
      else if (uVar3 == 0x8011) {
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        dVar20 = tan(*pvVar16);
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        *pvVar16 = dVar20;
      }
      else if (uVar3 == 0x8012) {
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        dVar20 = asin(*pvVar16);
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        *pvVar16 = dVar20;
      }
      else if (uVar3 == 0x8013) {
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        dVar20 = acos(*pvVar16);
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        *pvVar16 = dVar20;
      }
      else if (uVar3 == 0x8014) {
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        dVar20 = atan(*pvVar16);
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        *pvVar16 = dVar20;
      }
      else if (uVar3 == 0x8015) {
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        dVar20 = sinh(*pvVar16);
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        *pvVar16 = dVar20;
      }
      else if (uVar3 == 0x8016) {
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        dVar20 = cosh(*pvVar16);
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        *pvVar16 = dVar20;
      }
      else if (uVar3 == 0x8017) {
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        dVar20 = tanh(*pvVar16);
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        *pvVar16 = dVar20;
      }
      else if (uVar3 == 0x8018) {
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        dVar20 = tgamma(*pvVar16);
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        *pvVar16 = dVar20;
      }
      else if (uVar3 == 0x8019) {
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        dVar20 = lgamma(*pvVar16);
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        *pvVar16 = dVar20;
      }
      else if (uVar3 == 0x801a) {
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                   *(size_type *)(*in_FS_OFFSET + -0xb0));
        tVar19 = boost::math::digamma<double>((double)in_stack_fffffffffffffb80);
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        *pvVar16 = tVar19;
      }
      else if (uVar3 == 0x801b) {
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                   *(size_type *)(*in_FS_OFFSET + -0xb0));
        tVar19 = boost::math::trigamma<double>((double)in_stack_fffffffffffffb80);
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        *pvVar16 = tVar19;
      }
      else if (uVar3 == 0x801c) {
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        in_stack_fffffffffffffba0 = (vector<double,_std::allocator<double>_> *)erf(*pvVar16);
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        *pvVar16 = (value_type)in_stack_fffffffffffffba0;
      }
      else if (uVar3 == 0x801d) {
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                   *(size_type *)(*in_FS_OFFSET + -0xb0));
        tVar19 = boost::math::zeta<double>((double)in_stack_fffffffffffffb80);
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        *pvVar16 = tVar19;
      }
      else if (uVar3 == 0x801e) {
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        dVar20 = exp(-*pvVar16);
        in_stack_fffffffffffffb98 = 1.0 / (dVar20 + 1.0);
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        *pvVar16 = in_stack_fffffffffffffb98;
      }
      else if (uVar3 == 0x801f) {
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        if (*pvVar16 <= 15.0 && *pvVar16 != 15.0) {
          pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                               *(size_type *)(*in_FS_OFFSET + -0xb0));
          dVar20 = exp(*pvVar16);
          in_stack_fffffffffffffb90 = (allocator_type *)log(dVar20 + 1.0);
          pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                               *(size_type *)(*in_FS_OFFSET + -0xb0));
          *pvVar16 = (value_type)in_stack_fffffffffffffb90;
        }
      }
      else if (uVar3 == 0x8020) {
        dVar20 = sqrt(6.283185307179586);
        in_stack_fffffffffffffb80 =
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(1.0 / dVar20);
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                   *(size_type *)(*in_FS_OFFSET + -0xb0));
        _Var21 = std::pow<double,float>((double)in_stack_fffffffffffffb80,in_stack_fffffffffffffb7c)
        ;
        dVar20 = exp(-_Var21 * 0.5);
        in_stack_fffffffffffffb88 =
             (value_type_conflict *)((double)in_stack_fffffffffffffb80 * dVar20);
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
                             *(size_type *)(*in_FS_OFFSET + -0xb0));
        *pvVar16 = (value_type)in_stack_fffffffffffffb88;
      }
    }
    local_48 = (ulong)(local_40->field_1).call_info[1];
    local_50 = std::
               vector<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
               ::operator[]((vector<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
                             *)(in_RDI + 2),(ulong)(local_40->field_1).call_info[0]);
    std::allocator<double>::allocator((allocator<double> *)0x124d3f);
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_fffffffffffffba0,(size_type)in_stack_fffffffffffffb98,
               in_stack_fffffffffffffb90);
    std::allocator<double>::~allocator((allocator<double> *)0x124d6b);
    for (local_88 = 0; local_88 < local_48; local_88 = local_88 + 1) {
      lVar4 = *in_FS_OFFSET;
      sVar11 = *(size_type *)(*in_FS_OFFSET + -0xb0);
      *(size_type *)(*in_FS_OFFSET + -0xb0) = sVar11 - 1;
      pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(lVar4 + -0x68),sVar11);
      vVar2 = *pvVar16;
      pvVar16 = std::vector<double,_std::allocator<double>_>::operator[](&local_68,local_88);
      *pvVar16 = vVar2;
    }
    if (local_48 == local_50->n_args) {
      pvVar9 = std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
               operator[](&(local_50->expr).ast,0);
      pvVar10 = std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
                operator[]((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                            *)in_RSI,0);
      if ((pvVar9 == pvVar10) || (0x100 < *(ulong *)(*in_FS_OFFSET + -8))) goto LAB_00124e9a;
      in_FS_OFFSET[-1] = in_FS_OFFSET[-1] + 1;
      eval_ast(in_RSI,(AST *)in_RDX,arg_vals_00);
      *(long *)(*in_FS_OFFSET + -8) = *(long *)(*in_FS_OFFSET + -8) + -1;
      *(long *)(*in_FS_OFFSET + -0xb0) = *(long *)(*in_FS_OFFSET + -0xb0) + 1;
      local_8c = 0;
    }
    else {
LAB_00124e9a:
      *(vector<double,_std::allocator<double>_> **)(*in_FS_OFFSET + -0xb0) = arg_vals_00;
      local_8 = NAN;
      local_8c = 1;
    }
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb90);
    if (local_8c != 0) {
      return local_8;
    }
  } while( true );
}

Assistant:

double eval_ast(Environment& env, const Expr::AST& ast,
        const std::vector<double>& arg_vals) {
    // Main AST evaluation stack
    thread_local std::vector<double> stk;
    // Stack of thunks available:
    // contains positions of thunk_jmp encountered
    thread_local std::vector<size_t> thunks;
    // Thunk call stack: contains positions to return to
    // after reaching thunk_ret
    thread_local std::vector<size_t> thunks_stk;

    // Max function call stack height
    static const size_t MAX_CALL_STK_HEIGHT = 256;
    // Curr function call stack height
    thread_local size_t call_stk_height = 0;

    thread_local size_t top = -1;
    size_t init_top = top;

    // Make sure there is enough space
    stk.resize(top + ast.size() + 1);

#ifdef ENABLE_NIVALIS_BOOST_MATH
    using namespace boost;
    using namespace boost::math;
#endif
    using namespace nivalis::OpCode;

    bool _is_thunk_ret = false;

    // Shorthands for first, 2nd, 3rd arguments to operator
#define ARG3 stk[top-2]
#define ARG2 stk[top-1]
#define ARG1 stk[top]
// Return value from thunk or func call
#define RET_VAL stk[top+1]
// Quit without messing up stack
#define FAIL_AND_QUIT do {top = init_top; return NONE; } while(0)

    for (size_t cidx = ast.size() - 1; ~cidx; --cidx) {
        const auto& node = ast[cidx];
        switch(node.opcode) {
            case null: stk[++top] = NONE; break;
            case val:
                stk[++top] = node.val;  break;
            case ref:
                stk[++top] = env.vars[node.ref]; break;
            case arg:
                stk[++top] = arg_vals[node.ref]; break;
            case thunk_jmp:
                thunks.push_back(cidx);
                cidx -= ast[cidx].ref;
                break;
            case thunk_ret:
                cidx = thunks_stk.back() + 1;
                thunks_stk.pop_back();
                _is_thunk_ret = true;
                break;
            case call:
                {
                    size_t n_args = node.call_info[1];
                    auto& func = env.funcs[node.call_info[0]];
                    std::vector<double> f_args(n_args);
                    for (size_t i = 0; i < n_args; ++i) {
                        f_args[i] = stk[top--];
                    }
                    if (n_args != func.n_args ||               // Should not happen
                        &func.expr.ast[0] == &ast[0] ||        // Disallow recursion
                        call_stk_height > MAX_CALL_STK_HEIGHT) // Too many nested calls
                            FAIL_AND_QUIT;
                    ++call_stk_height;
                    eval_ast(env, func.expr.ast, f_args);
                    --call_stk_height;
                    ++top;
                }
                break;
            case bnz:
                if (_is_thunk_ret) {
                    --top; _is_thunk_ret = false;
                    ARG1 = RET_VAL;
                } else {
                    thunks_stk.push_back(cidx);
                    cidx = thunks[thunks.size() - (ARG1 == 0.) - 1];
                    thunks.resize(thunks.size() - 2);
                }
                break;

            case sums: case prods:
                {
                    if (_is_thunk_ret) {
                        --top; _is_thunk_ret = false;
                        // update arg3 (the output)
                        if (node.opcode == prods)
                            ARG3 *= RET_VAL;
                        else
                            ARG3 += RET_VAL; // arg3 is output
                    } else {
                        // Move over the arguments and use arg3
                        // as output
                        ++top; ARG1 = ARG2; ARG2 = ARG3;
                        ARG3 = node.opcode == prods ? 1. : 0.;
                    }
                    uint64_t var_id = node.ref;
                    int64_t a = static_cast<int64_t>(ARG1),
                            b = static_cast<int64_t>(ARG2);
                    int64_t step = (a <= b) ? 1 : -1;
                    if (std::isnan(ARG1)) {
                        top -= 2; thunks.pop_back();
                    } else {
                        env.vars[var_id] = static_cast<double>(a);
                        a += step;
                        if (a == b + step) ARG1 = NONE;
                        else ARG1 = static_cast<double>(a);
                        thunks_stk.push_back(cidx);
                        cidx = thunks.back();
                    }
                }
                break;

            case bsel: --top; break;
            case add: ARG2 += ARG1; --top; break;
            case sub: ARG2 = ARG1 - ARG2; --top; break;
            case mul: ARG2 *= ARG1;  --top; break;
            case divi: ARG2 = ARG1 / ARG2; --top; break;
            case mod: ARG2 = std::fmod(ARG1, ARG2); --top; break;
            case power: ARG2 = std::pow(ARG1, ARG2); --top; break;
            case logbase: ARG2 = log(ARG1) / log(ARG2); --top; break;
            case max: ARG2 = std::max(ARG1, ARG2); --top; break;
            case min: ARG2 = std::min(ARG1, ARG2); --top; break;
            case land: ARG2 = static_cast<double>(ARG1 && ARG2); --top; break;
            case lor: ARG2 = static_cast<double>(ARG1 || ARG2); --top; break;
            case lxor: ARG2 = static_cast<double>(
                               (ARG1 != 0.) ^ (ARG2 != 0.)); --top; break;
            case gcd: ARG2 = static_cast<double>(
                              std::gcd((int64_t) ARG1,
                                       (int64_t) ARG2)); --top; break;
            case lcm: ARG2 = ARG1 * ARG2 /
                      static_cast<double>(std::gcd(
                          (int64_t) ARG1, (int64_t) ARG2)); --top; break;
#ifdef ENABLE_NIVALIS_BOOST_MATH
            case choose: ARG2 = binomial_coefficient<double>(
                            (uint32_t)ARG1, (uint32_t)ARG2); --top; break;
            case fafact: ARG2 = falling_factorial<double>(
                            (uint32_t)ARG1, (uint32_t)ARG2); --top; break;
            case rifact: ARG2 = rising_factorial<double>(
                            (uint32_t)ARG1, (uint32_t)ARG2); --top; break;
            case betab: ARG2 = beta<double>(ARG1, ARG2); --top; break;
            case polygammab:
                        ARG2 = polygamma<double>((int)ARG1, ARG2); --top;
                        break;
#else
            case choose: {
                             double ad = std::round(ARG1);
                             double bd = std::round(ARG2);
                             if (ad < 0 || bd < 0) {
                                 ARG2 = std::numeric_limits<double>::quiet_NaN(); --top; break;
                             }
                             size_t a = static_cast<size_t>(ad), b = static_cast<size_t>(bd);
                             b = std::min(b, a-b);
                             ARG2 = fa_fact(a, a-b) / fa_fact(b);
                             --top; break;
                         }
            case fafact: {
                             double ad = std::round(ARG1);
                             double bd = std::round(ARG2);
                             if (ad < 0 || bd < 0) {
                                 ARG2 = std::numeric_limits<double>::quiet_NaN(); --top; break;
                             }
                             size_t a = static_cast<size_t>(ad), b = static_cast<size_t>(bd);
                             ARG2 = fa_fact(a, a-b);
                             --top; break;
                         }
            case rifact: {
                             double ad = std::round(ARG1);
                             double bd = std::round(ARG2);
                             if (ad < 0 || bd < 0) {
                                 ARG2 = std::numeric_limits<double>::quiet_NaN(); --top; break;
                             }
                             size_t a = static_cast<size_t>(ad), b = static_cast<size_t>(bd);
                             ARG2 = fa_fact(a+b-1, a-1);
                             --top; break;
                         }
            case betab: case polygammab:
                ARG1 = NONE; print_boost_warning(node.opcode); break;
#endif
            case lt: ARG2 = static_cast<double>(ARG1 < ARG2); --top; break;
            case le: ARG2 = static_cast<double>(ARG1 <= ARG2); --top; break;
            case eq: ARG2 = static_cast<double>(ARG1 == ARG2); --top; break;
            case ne: ARG2 = static_cast<double>(ARG1 != ARG2); --top; break;
            case ge: ARG2 = static_cast<double>(ARG1 >= ARG2); --top; break;
            case gt: ARG2 = static_cast<double>(ARG1 > ARG2); --top; break;

            case unaryminus: ARG1 = -ARG1; break;
            case lnot: ARG1 = static_cast<double>(!(ARG1)); break;
            case absb: ARG1 = std::fabs(ARG1); break;
            case sqrtb: ARG1 = std::sqrt(ARG1); break;
            case sqrb: ARG1 *= ARG1; break;
            case sgn: ARG1 = ARG1 > 0 ? 1 : (ARG1 == 0 ? 0 : -1); break;
            case floorb: ARG1 = floor(ARG1); break;
            case ceilb: ARG1 = ceil(ARG1); break; case roundb: ARG1 = round(ARG1); break;

            case expb:   ARG1 = exp(ARG1); break; case exp2b: ARG1 = exp2(ARG1); break;
            case logb:   ARG1 = log(ARG1); break;
            case factb:
                        {
                            unsigned n = static_cast<unsigned>(std::max(
                                        ARG1, 0.));
#ifdef ENABLE_NIVALIS_BOOST_MATH
                            ARG1 = factorial<double>(n);
#else
                            ARG1 = fa_fact(n, 1);
#endif
                        }
                        break;
            case log2b: ARG1 = log2(ARG1); break;  case log10b: ARG1 = log10(ARG1); break;
            case sinb: ARG1 = sin(ARG1); break;   case cosb:   ARG1 = cos(ARG1); break;
            case tanb: ARG1 = tan(ARG1); break;   case asinb: ARG1 = asin(ARG1); break;
            case acosb: ARG1 = acos(ARG1); break;  case atanb: ARG1 = atan(ARG1); break;
            case sinhb: ARG1 = sinh(ARG1); break;  case coshb: ARG1 = cosh(ARG1); break;
            case tanhb: ARG1 = tanh(ARG1); break;
            case tgammab: ARG1 = std::tgamma(ARG1); break;
            case lgammab: ARG1 = std::lgamma(ARG1); break;
#ifdef ENABLE_NIVALIS_BOOST_MATH
            case digammab: ARG1 = digamma<double>(ARG1); break;
            case trigammab: ARG1 = trigamma<double>(ARG1); break;
            case zetab: ARG1 = zeta<double>(ARG1); break;
#else
           // The following functions are unavailable without Boost
            case digammab: case trigammab: case zetab:
                ARG1 = NONE; print_boost_warning(node.opcode); break;
#endif
            case erfb: ARG1 = erf(ARG1); break;
            case sigmoidb: ARG1 = 1.f / (1.f + exp(-ARG1)); break;
            case softplusb: {
                                if (ARG1 < 15.f) {
                                    ARG1 = log(1.f + exp(ARG1));
                                }
                            }
                            break;
            case gausspdfb: ARG1 = 1.f / sqrt(M_PI * 2.f) * exp(-pow(ARG1, 2.f) * 0.5f); break;
        }
    }
    return stk[top--];
}